

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::createPredList(Graph *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  uint uVar2;
  long lVar3;
  iterator __position;
  undefined8 in_RAX;
  int (*paiVar4) [50];
  ulong uVar5;
  int j;
  long lVar6;
  ulong uVar7;
  vector<int,_std::allocator<int>_> *this_00;
  undefined8 uStack_38;
  
  uVar2 = this->num_of_vert;
  pvVar1 = this->pred_list;
  lVar6 = 0;
  uStack_38 = in_RAX;
  do {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar6),1);
    lVar3 = *(long *)((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar6);
    if (*(long *)((long)&this->pred_list[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + lVar6) != lVar3) {
      *(long *)((long)&this->pred_list[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + lVar6) = lVar3;
    }
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x4b0);
  if (0 < (int)uVar2) {
    paiVar4 = this->adj_matrix;
    uVar5 = 0;
    do {
      uVar5 = uVar5 + 1;
      uVar7 = 0;
      this_00 = pvVar1;
      do {
        if (0 < (*paiVar4)[uVar7]) {
          uStack_38 = CONCAT44((int)uVar5,(undefined4)uStack_38);
          __position._M_current =
               (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (this_00,__position,(int *)((long)&uStack_38 + 4));
          }
          else {
            *__position._M_current = (int)uVar5;
            (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_finish = __position._M_current + 1;
          }
        }
        uVar7 = uVar7 + 1;
        this_00 = this_00 + 1;
      } while (uVar2 != uVar7);
      paiVar4 = paiVar4 + 1;
    } while (uVar5 != uVar2);
  }
  return;
}

Assistant:

void Graph::createPredList(){
   int nv = this->num_of_vert;
   this->clearPredList();
   for(int i = 0; i < nv; i++)
      for(int j = 0; j < nv; j++){
         if(this->adj_matrix[i][j] >= 1)
            // pushes index of current column + 1 (current vertex)
            this->pred_list[j].push_back(i + 1);
      }
   return void();
}